

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
Jam_Turn(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int dep,GameBoard *gameBoard,
        int pl_col,vector<double,_std::allocator<double>_> *A_i)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int *in_stack_ffffffffffffffa0;
  int local_4c;
  vector<int,_std::allocator<int>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  double local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = 100000;
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    iVar2 = gameBoard->typeCountForColor[pl_col][lVar3];
    if (iVar2 <= iVar4) {
      iVar4 = iVar2;
    }
  }
  local_48 = __return_storage_ptr__;
  local_40 = A_i;
  for (local_4c = 0; local_4c < 7; local_4c = local_4c + 1) {
    iVar2 = gameBoard->typeCountForColor[pl_col][local_4c];
    if (iVar2 <= iVar4 + 1) {
      gameBoard->typeCountForColor[pl_col][local_4c] = iVar2 + 1;
      local_38 = Place_Turn(dep + 1,gameBoard,pl_col,local_4c,&nouse,&nouse,&nouse,
                            in_stack_ffffffffffffffa0);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_40,&local_38);
      std::vector<int,_std::allocator<int>_>::push_back(local_48,&local_4c);
      piVar1 = gameBoard->typeCountForColor[pl_col] + local_4c;
      *piVar1 = *piVar1 + -1;
    }
  }
  return local_48;
}

Assistant:

vector<int> Jam_Turn(int dep, GameBoard &gameBoard, int pl_col, vector<double> &A_i) //返回可行方案编号
{
    int  min_type = 1e5;
    vector<int> index;
    for (int i = 0; i < 7; i++)
        min_type = std::min(gameBoard.typeCountForColor[pl_col][i], min_type);
    for (int i = 0; i < 7; i++)
        if (gameBoard.typeCountForColor[pl_col][i] <= min_type + 1)
        {
            gameBoard.typeCountForColor[pl_col][i] ++;
            A_i.push_back(Place_Turn(dep + 1, gameBoard, pl_col, i));
            index.push_back(i);
            gameBoard.typeCountForColor[pl_col][i] --;
        }
    return index;
}